

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O0

void __thiscall
ApprovalTests::CommandReporter::useCygwinConversions(CommandReporter *this,bool useCygwin)

{
  byte in_SIL;
  shared_ptr<ApprovalTests::ConvertForCygwin> *in_RDI;
  shared_ptr<ApprovalTests::ConvertForCygwin> *in_stack_ffffffffffffffd0;
  
  if ((in_SIL & 1) == 0) {
    ::std::make_shared<ApprovalTests::DoNothing>();
    ::std::shared_ptr<ApprovalTests::ConvertForCygwin>::operator=
              (in_stack_ffffffffffffffd0,(shared_ptr<ApprovalTests::DoNothing> *)in_RDI);
    ::std::shared_ptr<ApprovalTests::DoNothing>::~shared_ptr
              ((shared_ptr<ApprovalTests::DoNothing> *)0x162eb0);
  }
  else {
    ::std::make_shared<ApprovalTests::ConvertForCygwin>();
    ::std::shared_ptr<ApprovalTests::ConvertForCygwin>::operator=(in_stack_ffffffffffffffd0,in_RDI);
    ::std::shared_ptr<ApprovalTests::ConvertForCygwin>::~shared_ptr
              ((shared_ptr<ApprovalTests::ConvertForCygwin> *)0x162e88);
  }
  return;
}

Assistant:

void CommandReporter::useCygwinConversions(bool useCygwin)
    {
        if (useCygwin)
        {
            converter = std::make_shared<ConvertForCygwin>();
        }
        else
        {
            converter = std::make_shared<DoNothing>();
        }
    }